

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode seturl(char *url,CURLU *u,uint flags)

{
  CURLU *__src;
  _Bool _Var1;
  int iVar2;
  CURLUcode CVar3;
  size_t sVar4;
  char *pcVar5;
  Curl_handler *pCVar6;
  char *pcVar7;
  bool bVar8;
  char *local_c8;
  char *local_c0;
  char *newp;
  int i;
  size_t len;
  char *hostp;
  char *p;
  char *ptr;
  Curl_handler *h;
  size_t urllen;
  size_t schemelen;
  char *schemep;
  char schemebuf [8];
  _Bool url_has_scheme;
  CURLUcode result;
  char *fragment;
  char *query;
  char *hostname;
  char *pcStack_30;
  _Bool path_alloced;
  char *path;
  CURLU *pCStack_20;
  uint flags_local;
  CURLU *u_local;
  char *url_local;
  
  hostname._7_1_ = 0;
  stack0xffffffffffffffb0 = (char *)0x0;
  schemebuf[0] = '\0';
  schemelen = 0;
  urllen = 0;
  if (url == (char *)0x0) {
    url_local._4_4_ = CURLUE_MALFORMED_INPUT;
  }
  else {
    path._4_4_ = flags;
    pCStack_20 = u;
    u_local = (CURLU *)url;
    sVar4 = strlen(url);
    pcStack_30 = (char *)(*Curl_cmalloc)(sVar4 * 2 + 2);
    pCStack_20->scratch = pcStack_30;
    if (pcStack_30 == (char *)0x0) {
      url_local._4_4_ = CURLUE_OUT_OF_MEMORY;
    }
    else {
      query = pcStack_30 + sVar4 + 1;
      *query = '\0';
      _Var1 = Curl_is_absolute_url((char *)u_local,(char *)((long)&schemep + 3),8);
      if (_Var1) {
        schemebuf[0] = '\x01';
        urllen = strlen((char *)((long)&schemep + 3));
      }
      if (((schemebuf[0] & 1U) == 0) ||
         (iVar2 = Curl_strcasecompare((char *)((long)&schemep + 3),"file"), iVar2 == 0)) {
        *pcStack_30 = '\0';
        if ((schemebuf[0] & 1U) == 0) {
          if ((path._4_4_ & 0x204) == 0) {
            return CURLUE_MALFORMED_INPUT;
          }
          if ((path._4_4_ & 4) != 0) {
            schemelen = (size_t)anon_var_dwarf_2edd2;
          }
          hostp = (char *)u_local;
          __src = u_local;
        }
        else {
          newp._4_4_ = 0;
          hostp = (char *)((long)&u_local->scheme + urllen + 1);
          while( true ) {
            bVar8 = false;
            if ((hostp != (char *)0x0) && (bVar8 = false, *hostp == '/')) {
              bVar8 = newp._4_4_ < 4;
            }
            if (!bVar8) break;
            hostp = hostp + 1;
            newp._4_4_ = newp._4_4_ + 1;
          }
          if ((newp._4_4_ < 1) || (3 < newp._4_4_)) {
            return CURLUE_MALFORMED_INPUT;
          }
          schemelen = (long)&schemep + 3;
          pCVar6 = Curl_builtin_scheme((char *)schemelen);
          if ((pCVar6 == (Curl_handler *)0x0) && ((path._4_4_ & 8) == 0)) {
            return CURLUE_UNSUPPORTED_SCHEME;
          }
          CVar3 = junkscan((char *)schemelen);
          __src = (CURLU *)hostp;
          if (CVar3 != CURLUE_OK) {
            return CURLUE_MALFORMED_INPUT;
          }
        }
        while( true ) {
          bVar8 = false;
          if (*hostp != '\0') {
            bVar8 = true;
            if ((*hostp != '/') && (bVar8 = true, *hostp != '?')) {
              bVar8 = *hostp == '#';
            }
            bVar8 = (bool)(bVar8 ^ 1);
          }
          if (!bVar8) break;
          hostp = hostp + 1;
        }
        sVar4 = (long)hostp - (long)__src;
        if (sVar4 == 0) {
          return CURLUE_MALFORMED_INPUT;
        }
        memcpy(query,__src,sVar4);
        query[sVar4] = '\0';
        if (((path._4_4_ & 0x200) != 0) && (schemelen == 0)) {
          iVar2 = curl_strnequal("ftp.",query,4);
          if (iVar2 == 0) {
            iVar2 = curl_strnequal("dict.",query,5);
            if (iVar2 == 0) {
              iVar2 = curl_strnequal("ldap.",query,5);
              if (iVar2 == 0) {
                iVar2 = curl_strnequal("imap.",query,5);
                if (iVar2 == 0) {
                  iVar2 = curl_strnequal("smtp.",query,5);
                  if (iVar2 == 0) {
                    iVar2 = curl_strnequal("pop3.",query,5);
                    if (iVar2 == 0) {
                      schemelen = (size_t)anon_var_dwarf_1e464;
                    }
                    else {
                      schemelen = (size_t)anon_var_dwarf_38a41;
                    }
                  }
                  else {
                    schemelen = (size_t)anon_var_dwarf_38a78;
                  }
                }
                else {
                  schemelen = (size_t)anon_var_dwarf_38a2d;
                }
              }
              else {
                schemelen = (size_t)anon_var_dwarf_e0825;
              }
            }
            else {
              schemelen = (size_t)anon_var_dwarf_389c3;
            }
          }
          else {
            schemelen = (long)"tftp" + 1;
          }
        }
        sVar4 = strlen(hostp);
        memcpy(pcStack_30,hostp,sVar4);
        pcStack_30[sVar4] = '\0';
        pcVar7 = (*Curl_cstrdup)((char *)schemelen);
        pCStack_20->scheme = pcVar7;
        if (pCStack_20->scheme == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
      }
      else {
        strcpy(pcStack_30,(char *)((long)&u_local->scheme + 5));
        query = (char *)0x0;
        pcVar5 = (*Curl_cstrdup)("file");
        pcVar7 = pcStack_30;
        pCStack_20->scheme = pcVar5;
        if (pCStack_20->scheme == (char *)0x0) {
          return CURLUE_OUT_OF_MEMORY;
        }
        if ((*pcStack_30 == '/') && (pcStack_30[1] == '/')) {
          p = pcStack_30 + 2;
          if ((*p != '/') &&
             ((((*p < 'a' || ('z' < *p)) && ((*p < 'A' || ('Z' < *p)))) ||
              (((pcStack_30[3] != ':' && (pcStack_30[3] != '|')) ||
               ((pcStack_30[4] != '/' && ((pcStack_30[4] != '\\' && (pcStack_30[4] != '\0'))))))))))
          {
            iVar2 = curl_strnequal("localhost/",p,10);
            if ((iVar2 == 0) && (iVar2 = curl_strnequal("127.0.0.1/",p,10), iVar2 == 0)) {
              return CURLUE_MALFORMED_INPUT;
            }
            p = pcVar7 + 0xb;
          }
          pcStack_30 = p;
        }
        if (((((*pcStack_30 == '/') &&
              ((('`' < pcStack_30[1] && (pcStack_30[1] < '{')) ||
               (('@' < pcStack_30[1] && (pcStack_30[1] < '[')))))) &&
             ((pcStack_30[2] == ':' || (pcStack_30[2] == '|')))) &&
            ((pcStack_30[3] == '/' || ((pcStack_30[3] == '\\' || (pcStack_30[3] == '\0')))))) ||
           ((((('`' < *pcStack_30 && (*pcStack_30 < '{')) ||
              (('@' < *pcStack_30 && (*pcStack_30 < '[')))) &&
             ((pcStack_30[1] == ':' || (pcStack_30[1] == '|')))) &&
            (((pcStack_30[2] == '/' || (pcStack_30[2] == '\\')) || (pcStack_30[2] == '\0')))))) {
          return CURLUE_MALFORMED_INPUT;
        }
      }
      pCVar6 = Curl_builtin_scheme(pCStack_20->scheme);
      CVar3 = junkscan(pcStack_30);
      if (CVar3 == CURLUE_OK) {
        pcVar7 = strchr(pcStack_30,0x3f);
        fragment = pcVar7;
        if (pcVar7 != (char *)0x0) {
          fragment = pcVar7 + 1;
          *pcVar7 = '\0';
        }
        if (fragment == (char *)0x0) {
          local_c0 = pcStack_30;
        }
        else {
          local_c0 = fragment;
        }
        pcVar7 = strchr(local_c0,0x23);
        unique0x100005e4 = pcVar7;
        if (pcVar7 != (char *)0x0) {
          register0x00000008 = pcVar7 + 1;
          *pcVar7 = '\0';
        }
        if (*pcStack_30 == '\0') {
          pcStack_30 = (char *)0x0;
        }
        else if ((path._4_4_ & 0x10) == 0) {
          pcVar7 = Curl_dedotdotify(pcStack_30);
          if (pcVar7 == (char *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
          iVar2 = strcmp(pcVar7,pcStack_30);
          if (iVar2 == 0) {
            (*Curl_cfree)(pcVar7);
          }
          else {
            hostname._7_1_ = 1;
            pcStack_30 = pcVar7;
          }
        }
        if (pcStack_30 != (char *)0x0) {
          if ((hostname._7_1_ & 1) == 0) {
            local_c8 = (*Curl_cstrdup)(pcStack_30);
          }
          else {
            local_c8 = pcStack_30;
          }
          pCStack_20->path = local_c8;
          if (pCStack_20->path == (char *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
        }
        if (query != (char *)0x0) {
          CVar3 = junkscan(query);
          if (CVar3 != CURLUE_OK) {
            return CURLUE_MALFORMED_INPUT;
          }
          schemebuf._1_4_ = parse_hostname_login(pCStack_20,pCVar6,&query,path._4_4_);
          if (schemebuf._1_4_ != CURLUE_OK) {
            return schemebuf._1_4_;
          }
          schemebuf._1_4_ = Curl_parse_port(pCStack_20,query);
          if (schemebuf._1_4_ != CURLUE_OK) {
            return schemebuf._1_4_;
          }
          schemebuf._1_4_ = hostname_check(query,path._4_4_);
          if (schemebuf._1_4_ != CURLUE_OK) {
            return schemebuf._1_4_;
          }
          pcVar7 = (*Curl_cstrdup)(query);
          pCStack_20->host = pcVar7;
          if (pCStack_20->host == (char *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
        }
        if (fragment != (char *)0x0) {
          pcVar7 = (*Curl_cstrdup)(fragment);
          pCStack_20->query = pcVar7;
          if (pCStack_20->query == (char *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
        }
        if ((stack0xffffffffffffffb0 != (char *)0x0) && (*stack0xffffffffffffffb0 != '\0')) {
          pcVar7 = (*Curl_cstrdup)(stack0xffffffffffffffb0);
          pCStack_20->fragment = pcVar7;
          if (pCStack_20->fragment == (char *)0x0) {
            return CURLUE_OUT_OF_MEMORY;
          }
        }
        (*Curl_cfree)(pCStack_20->scratch);
        pCStack_20->scratch = (char *)0x0;
        url_local._4_4_ = CURLUE_OK;
      }
      else {
        url_local._4_4_ = CURLUE_MALFORMED_INPUT;
      }
    }
  }
  return url_local._4_4_;
}

Assistant:

static CURLUcode seturl(const char *url, CURLU *u, unsigned int flags)
{
  char *path;
  bool path_alloced = FALSE;
  char *hostname;
  char *query = NULL;
  char *fragment = NULL;
  CURLUcode result;
  bool url_has_scheme = FALSE;
  char schemebuf[MAX_SCHEME_LEN];
  char *schemep = NULL;
  size_t schemelen = 0;
  size_t urllen;
  const struct Curl_handler *h = NULL;

  if(!url)
    return CURLUE_MALFORMED_INPUT;

  /*************************************************************
   * Parse the URL.
   ************************************************************/
  /* allocate scratch area */
  urllen = strlen(url);
  path = u->scratch = malloc(urllen * 2 + 2);
  if(!path)
    return CURLUE_OUT_OF_MEMORY;

  hostname = &path[urllen + 1];
  hostname[0] = 0;

  if(Curl_is_absolute_url(url, schemebuf, sizeof(schemebuf))) {
    url_has_scheme = TRUE;
    schemelen = strlen(schemebuf);
  }

  /* handle the file: scheme */
  if(url_has_scheme && strcasecompare(schemebuf, "file")) {
    /* path has been allocated large enough to hold this */
    strcpy(path, &url[5]);

    hostname = NULL; /* no host for file: URLs */
    u->scheme = strdup("file");
    if(!u->scheme)
      return CURLUE_OUT_OF_MEMORY;

    /* Extra handling URLs with an authority component (i.e. that start with
     * "file://")
     *
     * We allow omitted hostname (e.g. file:/<path>) -- valid according to
     * RFC 8089, but not the (current) WHAT-WG URL spec.
     */
    if(path[0] == '/' && path[1] == '/') {
      /* swallow the two slashes */
      char *ptr = &path[2];

      /*
       * According to RFC 8089, a file: URL can be reliably dereferenced if:
       *
       *  o it has no/blank hostname, or
       *
       *  o the hostname matches "localhost" (case-insensitively), or
       *
       *  o the hostname is a FQDN that resolves to this machine.
       *
       * For brevity, we only consider URLs with empty, "localhost", or
       * "127.0.0.1" hostnames as local.
       *
       * Additionally, there is an exception for URLs with a Windows drive
       * letter in the authority (which was accidentally omitted from RFC 8089
       * Appendix E, but believe me, it was meant to be there. --MK)
       */
      if(ptr[0] != '/' && !STARTS_WITH_URL_DRIVE_PREFIX(ptr)) {
        /* the URL includes a host name, it must match "localhost" or
           "127.0.0.1" to be valid */
        if(!checkprefix("localhost/", ptr) &&
           !checkprefix("127.0.0.1/", ptr)) {
          /* Invalid file://hostname/, expected localhost or 127.0.0.1 or
             none */
          return CURLUE_MALFORMED_INPUT;
        }
        ptr += 9; /* now points to the slash after the host */
      }

      path = ptr;
    }

#if !defined(MSDOS) && !defined(WIN32) && !defined(__CYGWIN__)
    /* Don't allow Windows drive letters when not in Windows.
     * This catches both "file:/c:" and "file:c:" */
    if(('/' == path[0] && STARTS_WITH_URL_DRIVE_PREFIX(&path[1])) ||
       STARTS_WITH_URL_DRIVE_PREFIX(path)) {
      /* File drive letters are only accepted in MSDOS/Windows */
      return CURLUE_MALFORMED_INPUT;
    }
#else
    /* If the path starts with a slash and a drive letter, ditch the slash */
    if('/' == path[0] && STARTS_WITH_URL_DRIVE_PREFIX(&path[1])) {
      /* This cannot be done with strcpy, as the memory chunks overlap! */
      memmove(path, &path[1], strlen(&path[1]) + 1);
    }
#endif

  }
  else {
    /* clear path */
    const char *p;
    const char *hostp;
    size_t len;
    path[0] = 0;

    if(url_has_scheme) {
      int i = 0;
      p = &url[schemelen + 1];
      while(p && (*p == '/') && (i < 4)) {
        p++;
        i++;
      }
      if((i < 1) || (i>3))
        /* less than one or more than three slashes */
        return CURLUE_MALFORMED_INPUT;

      schemep = schemebuf;
      if(!Curl_builtin_scheme(schemep) &&
         !(flags & CURLU_NON_SUPPORT_SCHEME))
        return CURLUE_UNSUPPORTED_SCHEME;

      if(junkscan(schemep))
        return CURLUE_MALFORMED_INPUT;
    }
    else {
      /* no scheme! */

      if(!(flags & (CURLU_DEFAULT_SCHEME|CURLU_GUESS_SCHEME)))
        return CURLUE_MALFORMED_INPUT;
      if(flags & CURLU_DEFAULT_SCHEME)
        schemep = (char *) DEFAULT_SCHEME;

      /*
       * The URL was badly formatted, let's try without scheme specified.
       */
      p = url;
    }
    hostp = p; /* host name starts here */

    while(*p && !HOSTNAME_END(*p)) /* find end of host name */
      p++;

    len = p - hostp;
    if(!len)
      return CURLUE_MALFORMED_INPUT;

    memcpy(hostname, hostp, len);
    hostname[len] = 0;

    if((flags & CURLU_GUESS_SCHEME) && !schemep) {
      /* legacy curl-style guess based on host name */
      if(checkprefix("ftp.", hostname))
        schemep = (char *)"ftp";
      else if(checkprefix("dict.", hostname))
        schemep = (char *)"dict";
      else if(checkprefix("ldap.", hostname))
        schemep = (char *)"ldap";
      else if(checkprefix("imap.", hostname))
        schemep = (char *)"imap";
      else if(checkprefix("smtp.", hostname))
        schemep = (char *)"smtp";
      else if(checkprefix("pop3.", hostname))
        schemep = (char *)"pop3";
      else
        schemep = (char *)"http";
    }

    len = strlen(p);
    memcpy(path, p, len);
    path[len] = 0;

    u->scheme = strdup(schemep);
    if(!u->scheme)
      return CURLUE_OUT_OF_MEMORY;
  }

  /* if this is a known scheme, get some details */
  h = Curl_builtin_scheme(u->scheme);

  if(junkscan(path))
    return CURLUE_MALFORMED_INPUT;

  query = strchr(path, '?');
  if(query)
    *query++ = 0;

  fragment = strchr(query?query:path, '#');
  if(fragment)
    *fragment++ = 0;

  if(!path[0])
    /* if there's no path set, unset */
    path = NULL;
  else if(!(flags & CURLU_PATH_AS_IS)) {
    /* sanitise paths and remove ../ and ./ sequences according to RFC3986 */
    char *newp = Curl_dedotdotify(path);
    if(!newp)
      return CURLUE_OUT_OF_MEMORY;

    if(strcmp(newp, path)) {
      /* if we got a new version */
      path = newp;
      path_alloced = TRUE;
    }
    else
      free(newp);
  }
  if(path) {
    u->path = path_alloced?path:strdup(path);
    if(!u->path)
      return CURLUE_OUT_OF_MEMORY;
  }

  if(hostname) {
    /*
     * Parse the login details and strip them out of the host name.
     */
    if(junkscan(hostname))
      return CURLUE_MALFORMED_INPUT;

    result = parse_hostname_login(u, h, &hostname, flags);
    if(result)
      return result;

    result = Curl_parse_port(u, hostname);
    if(result)
      return result;

    result = hostname_check(hostname, flags);
    if(result)
      return result;

    u->host = strdup(hostname);
    if(!u->host)
      return CURLUE_OUT_OF_MEMORY;
  }

  if(query) {
    u->query = strdup(query);
    if(!u->query)
      return CURLUE_OUT_OF_MEMORY;
  }
  if(fragment && fragment[0]) {
    u->fragment = strdup(fragment);
    if(!u->fragment)
      return CURLUE_OUT_OF_MEMORY;
  }

  free(u->scratch);
  u->scratch = NULL;

  return CURLUE_OK;
}